

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  pointer paVar13;
  pointer pfVar14;
  pointer pfVar15;
  pointer pfVar16;
  bool bVar17;
  int iVar18;
  int *piVar19;
  long lVar20;
  ostream *poVar21;
  long *plVar22;
  undefined8 uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  char *this;
  uint uVar27;
  ulong uVar28;
  pointer paVar29;
  uint uVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  int comp;
  int h;
  int w;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string base_dir;
  string err;
  default_random_engine generator;
  string warn;
  string filename;
  attrib_t attrib;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  float n [3] [3];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  if (argc < 2) {
    printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
    iVar18 = 1;
  }
  else {
    if (argc == 2) {
      fVar32 = 10000.0;
    }
    else {
      std::__cxx11::string::string((string *)n,argv[2],(allocator *)&warn);
      uVar23 = n[0]._0_8_;
      piVar19 = __errno_location();
      iVar18 = *piVar19;
      *piVar19 = 0;
      lVar20 = strtol((char *)uVar23,(char **)&attrib,10);
      if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)uVar23) {
        std::__throw_invalid_argument("stoi");
LAB_00113c4f:
        uVar23 = std::__throw_out_of_range("stoi");
        _Unwind_Resume(uVar23);
      }
      if (((int)lVar20 != lVar20) || (*piVar19 == 0x22)) goto LAB_00113c4f;
      if (*piVar19 == 0) {
        *piVar19 = iVar18;
      }
      if ((float *)n[0]._0_8_ != n[1] + 1) {
        operator_delete((void *)n[0]._0_8_);
      }
      fVar32 = (float)(int)lVar20;
    }
    puts("# pc sampler");
    generator._M_x = 1;
    memset(&attrib,0,0x90);
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    warn._M_string_length = 0;
    warn.field_2._M_local_buf[0] = '\0';
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&filename,argv[1],(allocator *)n);
    lVar20 = std::__cxx11::string::find_last_of((char *)&filename,0x128c16,0xffffffffffffffff);
    if (lVar20 == -1) {
      base_dir._M_dataplus._M_p = (pointer)&base_dir.field_2;
      base_dir._M_string_length = 0;
      base_dir.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::find_last_of((char *)&filename,0x128c16,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)&base_dir,(ulong)&filename);
    }
    if (base_dir._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&base_dir,0,(char *)0x0,0x128899);
    }
    std::__cxx11::string::append((char *)&base_dir);
    tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,filename._M_dataplus._M_p,
                     base_dir._M_dataplus._M_p,true,true);
    printf("# of vertices  = %d\n",
           (ulong)(uint)((int)((ulong)((long)attrib.vertices.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)attrib.vertices.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
    printf("# of normals   = %d\n",
           (ulong)(uint)((int)((ulong)((long)attrib.normals.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)attrib.normals.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
    printf("# of texcoords = %d\n",
           (ulong)(uint)((int)(((uint)((ulong)((long)attrib.texcoords.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                              (long)attrib.texcoords.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 0x21)
                               & 1) + (int)((ulong)((long)attrib.texcoords.
                                                                                                                    
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)attrib.texcoords.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2))
                        >> 1));
    this = (char *)&materials;
    printf("# of materials = %d\n",
           (ulong)(uint)((int)((ulong)((long)materials.
                                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)materials.
                                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x1fdcd759));
    printf("# of shapes    = %d\n");
    memset((anon_struct_1864_47_e17b0a7f *)n,0,0x748);
    n[0]._0_8_ = n[1] + 1;
    n[0][2] = 0.0;
    n[1][0] = 0.0;
    n[1][1] = (float)((uint)n[1][1] & 0xffffff00);
    local_58._M_left = &local_58;
    local_58._M_color = _S_red;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = 0;
    local_58._M_right = local_58._M_left;
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
    emplace_back<tinyobj::material_t>
              ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)this,
               (anon_struct_1864_47_e17b0a7f *)n);
    tinyobj::anon_struct_1864_47_e17b0a7f::~material_t((anon_struct_1864_47_e17b0a7f *)n);
    if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar20 = 0x90;
      this = "# material[%d].diffuse_texname = %s\n";
      uVar31 = 0;
      do {
        printf("# material[%d].diffuse_texname = %s\n",uVar31 & 0xffffffff,
               *(undefined8 *)
                ((long)(materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar20 + -0x20));
        uVar31 = uVar31 + 1;
        lVar20 = lVar20 + 0x748;
      } while (uVar31 < (ulong)(((long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x63fb9aeb1fdcd759));
    }
    if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar20 = 0x90;
      uVar31 = 0;
      do {
        paVar13 = materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)(materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar20 + -0x18)
            != 0) {
          n[0]._0_8_ = n[1] + 1;
          lVar10 = *(long *)((long)(materials.
                                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ambient +
                            lVar20 + -0x20);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)n,lVar10,
                     *(long *)((long)(materials.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->ambient +
                              lVar20 + -0x18) + lVar10);
          bVar17 = FileExists((string *)n);
          if (!bVar17) {
            std::operator+(&local_798,&base_dir,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)paVar13->ambient + lVar20 + -0x20));
            std::__cxx11::string::operator=((string *)n,(string *)&local_798);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_798._M_dataplus._M_p != &local_798.field_2) {
              operator_delete(local_798._M_dataplus._M_p);
            }
            bVar17 = FileExists((string *)n);
            if (!bVar17) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"# Unable to find file: ",0x17);
              poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   *(char **)((long)paVar13->ambient + lVar20 + -0x20),
                                   *(long *)((long)paVar13->ambient + lVar20 + -0x18));
              std::endl<char,std::char_traits<char>>(poVar21);
              goto LAB_00113bdc;
            }
          }
          this = (char *)stbi_load((char *)n[0]._0_8_,&w,&h,&comp,0);
          if ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)this ==
              (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"# Unable to load texture: ",0x1a);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)n[0]._0_8_,n._8_8_);
            std::endl<char,std::char_traits<char>>(poVar21);
LAB_00113bdc:
            exit(1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Loaded texture: ",0x12);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)n[0]._0_8_,n._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", w = ",6);
          poVar21 = (ostream *)std::ostream::operator<<(poVar21,w);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", h = ",6);
          poVar21 = (ostream *)std::ostream::operator<<(poVar21,h);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,", comp = ",9);
          plVar22 = (long *)std::ostream::operator<<(poVar21,comp);
          std::ios::widen((char)*(undefined8 *)(*plVar22 + -0x18) + (char)plVar22);
          std::ostream::put((char)plVar22);
          std::ostream::flush();
          if ((float *)n[0]._0_8_ != n[1] + 1) {
            operator_delete((void *)n[0]._0_8_);
          }
        }
        uVar31 = uVar31 + 1;
        lVar20 = lVar20 + 0x748;
      } while (uVar31 < (ulong)(((long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x63fb9aeb1fdcd759));
    }
    pfVar16 = attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar15 = attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pfVar14 = attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar29 = ((shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_start)->mesh).indices.
              super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (2 < (ulong)(((long)((shapes.
                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)paVar29 >> 2) *
                   -0x5555555555555555)) {
      uVar28 = (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      uVar31 = 0;
      do {
        iVar18 = paVar29[uVar31 * 3].normal_index;
        iVar7 = paVar29[uVar31 * 3 + 1].normal_index;
        iVar8 = paVar29[uVar31 * 3 + 2].normal_index;
        fVar37 = 0.0;
        fVar42 = 0.0;
        fVar33 = 0.0;
        fVar49 = 0.0;
        fVar54 = 0.0;
        fVar55 = 0.0;
        fVar38 = 0.0;
        fVar43 = 0.0;
        fVar50 = 0.0;
        if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish != pfVar16) {
          uVar27 = paVar29[uVar31 * 3].texcoord_index;
          fVar38 = fVar37;
          fVar43 = fVar42;
          fVar50 = fVar49;
          if ((-1 < (int)uVar27) &&
             (uVar30 = paVar29[uVar31 * 3 + 1].texcoord_index, -1 < (int)uVar30)) {
            uVar9 = paVar29[uVar31 * 3 + 2].texcoord_index;
            if (-1 < (int)uVar9) {
              uVar24 = (ulong)uVar27 * 2 + 1;
              if (uVar28 <= uVar24) {
                __assert_fail("attrib.texcoords.size() > size_t(2 * idx0.texcoord_index + 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                              ,0x94,"int main(int, char **)");
              }
              uVar25 = (ulong)uVar30 * 2 + 1;
              if (uVar28 <= uVar25) {
                __assert_fail("attrib.texcoords.size() > size_t(2 * idx1.texcoord_index + 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                              ,0x96,"int main(int, char **)");
              }
              uVar26 = (ulong)uVar9 * 2 + 1;
              if (uVar28 <= uVar26) {
                __assert_fail("attrib.texcoords.size() > size_t(2 * idx2.texcoord_index + 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                              ,0x98,"int main(int, char **)");
              }
              fVar38 = pfVar16[uVar27 * 2];
              fVar43 = 1.0 - pfVar16[uVar24];
              fVar33 = pfVar16[(ulong)uVar30 * 2 & 0xffffffff];
              fVar50 = 1.0 - pfVar16[uVar25];
              fVar54 = pfVar16[uVar9 * 2];
              fVar55 = 1.0 - pfVar16[uVar26];
            }
          }
        }
        if (paVar29[uVar31 * 3].vertex_index < 0) {
          __assert_fail("vi[0] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbc,"int main(int, char **)");
        }
        if (paVar29[uVar31 * 3 + 1].vertex_index < 0) {
          __assert_fail("vi[1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbd,"int main(int, char **)");
        }
        if (paVar29[uVar31 * 3 + 2].vertex_index < 0) {
          __assert_fail("vi[2] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbe,"int main(int, char **)");
        }
        uVar25 = (ulong)(uint)(paVar29[uVar31 * 3 + 1].vertex_index * 3);
        uVar26 = (ulong)(uint)(paVar29[uVar31 * 3 + 2].vertex_index * 3);
        uVar24 = (ulong)(uint)(paVar29[uVar31 * 3].vertex_index * 3);
        fVar37 = pfVar14[uVar24];
        fVar42 = pfVar14[uVar24 + 1];
        fVar49 = pfVar14[uVar24 + 2];
        fVar1 = pfVar14[uVar25];
        fVar2 = pfVar14[uVar25 + 1];
        fVar3 = pfVar14[uVar25 + 2];
        fVar4 = pfVar14[uVar26];
        fVar5 = pfVar14[uVar26 + 1];
        fVar6 = pfVar14[uVar26 + 2];
        lVar20 = 0;
        do {
          fVar47 = (float)(int)lVar20;
          fVar51 = (float)iVar18 * 3.0 + fVar47;
          uVar24 = (ulong)fVar51;
          fVar52 = (float)iVar7 * 3.0 + fVar47;
          uVar25 = (ulong)fVar52;
          n[0][lVar20] = pfVar15[(long)(fVar51 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24];
          fVar47 = fVar47 + (float)iVar8 * 3.0;
          uVar24 = (ulong)fVar47;
          n[1][lVar20] = pfVar15[(long)(fVar52 - 9.223372e+18) & (long)uVar25 >> 0x3f | uVar25];
          n[2][lVar20] = pfVar15[(long)(fVar47 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24];
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        fVar47 = (fVar49 - fVar3) * (fVar49 - fVar3) +
                 (fVar37 - fVar1) * (fVar37 - fVar1) + (fVar42 - fVar2) * (fVar42 - fVar2);
        if (fVar47 < 0.0) {
          fVar47 = sqrtf(fVar47);
        }
        else {
          fVar47 = SQRT(fVar47);
        }
        fVar51 = (fVar6 - fVar3) * (fVar6 - fVar3) +
                 (fVar4 - fVar1) * (fVar4 - fVar1) + (fVar5 - fVar2) * (fVar5 - fVar2);
        if (fVar51 < 0.0) {
          fVar51 = sqrtf(fVar51);
        }
        else {
          fVar51 = SQRT(fVar51);
        }
        fVar52 = (fVar49 - fVar6) * (fVar49 - fVar6) +
                 (fVar37 - fVar4) * (fVar37 - fVar4) + (fVar42 - fVar5) * (fVar42 - fVar5);
        if (fVar52 < 0.0) {
          fVar52 = sqrtf(fVar52);
        }
        else {
          fVar52 = SQRT(fVar52);
        }
        fVar34 = (fVar47 + fVar51 + fVar52) * 0.5;
        fVar47 = (fVar34 - fVar52) * (fVar34 - fVar51) * (fVar34 - fVar47) * fVar34;
        if (fVar47 < 0.0) {
          fVar47 = sqrtf(fVar47);
        }
        else {
          fVar47 = SQRT(fVar47);
        }
        uVar27 = (uint)(fVar32 * fVar47);
        printf("# area %f nsamples %d \n",SUB84((double)fVar47,0),(ulong)uVar27);
        if (0 < (int)uVar27) {
          fVar47 = n[0][0];
          fVar51 = n[0][1];
          fVar44 = n[1][0] - n[0][0];
          fVar45 = n[2][0] - n[0][0];
          fVar34 = n[1][1] - n[0][1];
          fVar35 = n[2][1] - n[0][1];
          fVar52 = n[0][2];
          fVar39 = n[1][2] - n[0][2];
          fVar40 = n[2][2] - n[0][2];
          uVar30 = 0;
          do {
            do {
              dVar11 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (&generator);
              dVar12 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (&generator);
              fVar41 = (float)(dVar11 + 0.0);
              fVar53 = (float)(dVar12 + 0.0);
            } while (1.0 < fVar41 + fVar53);
            fVar46 = fVar53 * (fVar54 - fVar38) + fVar41 * (fVar33 - fVar38) + fVar38;
            fVar48 = fVar53 * (fVar55 - fVar43) + fVar41 * (fVar50 - fVar43) + fVar43;
            fVar36 = 0.0;
            if (0.0 <= fVar46) {
              fVar36 = fVar46;
            }
            fVar46 = 1.0;
            if (fVar36 <= 1.0) {
              fVar46 = fVar36;
            }
            fVar36 = 0.0;
            if (0.0 <= fVar48) {
              fVar36 = fVar48;
            }
            fVar48 = 1.0;
            if (fVar36 <= 1.0) {
              fVar48 = fVar36;
            }
            lVar20 = (long)((int)(fVar48 * (float)h) * w + (int)(fVar46 * (float)w)) * (long)comp;
            printf("%f %f %f %f %f %f %d %d %d\n",
                   SUB84((double)(fVar53 * (fVar4 - fVar37) + fVar41 * (fVar1 - fVar37) + fVar37),0)
                   ,(double)(fVar53 * (fVar5 - fVar42) + fVar41 * (fVar2 - fVar42) + fVar42),
                   (double)(fVar53 * (fVar6 - fVar49) + fVar41 * (fVar3 - fVar49) + fVar49),
                   (double)(fVar53 * fVar45 + fVar41 * fVar44 + fVar47),
                   (double)(fVar53 * fVar35 + fVar41 * fVar34 + fVar51),
                   (double)(fVar53 * fVar40 + fVar41 * fVar39 + fVar52),
                   (ulong)*(byte *)((long)&(((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              *)this)->
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar20),
                   (ulong)*(byte *)((long)&(((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              *)this)->
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar20 + 1),
                   (ulong)*(byte *)((long)&(((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              *)this)->
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar20 + 2))
            ;
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar27);
        }
        paVar29 = ((shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar31 = uVar31 + 1;
      } while (uVar31 < (ulong)(((long)((shapes.
                                         super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar29 >>
                                2) * -0x5555555555555555) / 3);
    }
    free(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_dir._M_dataplus._M_p != &base_dir.field_2) {
      operator_delete(base_dir._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != &filename.field_2) {
      operator_delete(filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)err._M_dataplus._M_p != &err.field_2) {
      operator_delete(err._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)warn._M_dataplus._M_p != &warn.field_2) {
      operator_delete(warn._M_dataplus._M_p);
    }
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
    if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

int main(int argc, char ** argv){

    int point_per_sqm = 10000;

    if (argc < 2) {
      printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
      return 1;
    }
    if (argc >= 3) {
      point_per_sqm = std::stoi(argv[2]);
    }

    printf("# pc sampler\n");
    std::default_random_engine generator;
    std::uniform_real_distribution<double> distribution(0.0,1.0);

    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;

    std::string filename(argv[1]);
    std::string base_dir = GetBaseDir(filename);
    if (base_dir.empty()) {
        base_dir = ".";
    }

    base_dir += "/";


    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, filename.c_str(),
                              base_dir.c_str());

    printf("# of vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
    printf("# of normals   = %d\n", (int)(attrib.normals.size()) / 3);
    printf("# of texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
    printf("# of materials = %d\n", (int)materials.size());
    printf("# of shapes    = %d\n", (int)shapes.size());

    materials.push_back(tinyobj::material_t());
    unsigned char* image;
     int w, h;
      int comp;

    for (size_t i = 0; i < materials.size(); i++) {
        printf("# material[%d].diffuse_texname = %s\n", int(i),
        materials[i].diffuse_texname.c_str());
    }

    {
    for (size_t m = 0; m < materials.size(); m++) {
      tinyobj::material_t* mp = &materials[m];

      if (mp->diffuse_texname.length() > 0) {
        // Only load the texture if it is not already loaded
        {
         

          std::string texture_filename = mp->diffuse_texname;
          if (!FileExists(texture_filename)) {
            // Append base dir.
            texture_filename = base_dir + mp->diffuse_texname;
            if (!FileExists(texture_filename)) {
              std::cerr << "# Unable to find file: " << mp->diffuse_texname
                        << std::endl;
              exit(1);
            }
          }

          image = stbi_load(texture_filename.c_str(), &w, &h, &comp, STBI_default);
          if (!image) {
            std::cerr << "# Unable to load texture: " << texture_filename
                      << std::endl;
            exit(1);
          }
          std::cout << "# Loaded texture: " << texture_filename << ", w = " << w
                    << ", h = " << h << ", comp = " << comp << std::endl;
        }
      }
    }
  }

    int s = 0; //take first shape

    for (size_t f = 0; f < shapes[s].mesh.indices.size() / 3; f++) {

        tinyobj::index_t idx0 = shapes[s].mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = shapes[s].mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = shapes[s].mesh.indices[3 * f + 2];

        int current_material_id = shapes[s].mesh.material_ids[f];

        if ((current_material_id < 0) ||
            (current_material_id >= static_cast<int>(materials.size()))) {
          // Invaid material ID. Use default material.
          current_material_id =
              materials.size() -
              1;  // Default material is added to the last item in `materials`.
        }
        
       float tc[3][2];
        if (attrib.texcoords.size() > 0) {
          if ((idx0.texcoord_index < 0) || (idx1.texcoord_index < 0) ||
              (idx2.texcoord_index < 0)) {
            // face does not contain valid uv index.
            tc[0][0] = 0.0f;
            tc[0][1] = 0.0f;
            tc[1][0] = 0.0f;
            tc[1][1] = 0.0f;
            tc[2][0] = 0.0f;
            tc[2][1] = 0.0f;
          } else {
            assert(attrib.texcoords.size() >
                   size_t(2 * idx0.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx1.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx2.texcoord_index + 1));

            // Flip Y coord.
            tc[0][0] = attrib.texcoords[2 * idx0.texcoord_index];
            tc[0][1] = 1.0f - attrib.texcoords[2 * idx0.texcoord_index + 1];
            tc[1][0] = attrib.texcoords[2 * idx1.texcoord_index];
            tc[1][1] = 1.0f - attrib.texcoords[2 * idx1.texcoord_index + 1];
            tc[2][0] = attrib.texcoords[2 * idx2.texcoord_index];
            tc[2][1] = 1.0f - attrib.texcoords[2 * idx2.texcoord_index + 1];
          }
        } else {
          tc[0][0] = 0.0f;
          tc[0][1] = 0.0f;
          tc[1][0] = 0.0f;
          tc[1][1] = 0.0f;
          tc[2][0] = 0.0f;
          tc[2][1] = 0.0f;
        }

        //printf("%f %f %f %f %f %f\n", tc[0][0], tc[0][1], tc[1][0], tc[1][1], tc[2][0], tc[2][1]);
        
        int vi[3];      // indexes
        float v[3][3];  // coordinates
        float ni[3];
        float n[3][3];


         for (int k = 0; k < 3; k++) {
          vi[0] = idx0.vertex_index;
          vi[1] = idx1.vertex_index;
          vi[2] = idx2.vertex_index;
          
          ni[0] = idx0.normal_index;
          ni[1] = idx1.normal_index;
          ni[2] = idx2.normal_index;

          assert(vi[0] >= 0);
          assert(vi[1] >= 0);
          assert(vi[2] >= 0);

          v[0][k] = attrib.vertices[3 * vi[0] + k];
          v[1][k] = attrib.vertices[3 * vi[1] + k];
          v[2][k] = attrib.vertices[3 * vi[2] + k];
        
          n[0][k] = attrib.normals[3 * ni[0] + k];
          n[1][k] = attrib.normals[3 * ni[1] + k];
          n[2][k] = attrib.normals[3 * ni[2] + k];
        

        }

        float area;

        float l0 = sqrt((v[0][0] - v[1][0]) * (v[0][0] - v[1][0]) + (v[0][1] - v[1][1]) * (v[0][1] - v[1][1]) + (v[0][2] - v[1][2]) * (v[0][2] - v[1][2]));
        float l1 = sqrt((v[2][0] - v[1][0]) * (v[2][0] - v[1][0]) + (v[2][1] - v[1][1]) * (v[2][1] - v[1][1]) + (v[2][2] - v[1][2]) * (v[2][2] - v[1][2]));
        float l2 = sqrt((v[0][0] - v[2][0]) * (v[0][0] - v[2][0]) + (v[0][1] - v[2][1]) * (v[0][1] - v[2][1]) + (v[0][2] - v[2][2]) * (v[0][2] - v[2][2]));
        
        float s = (l0 + l1 + l2)/2;

        area = sqrt(s * (s-l0) * (s-l1) * (s-l2));
        
        int nsamples = int(area * point_per_sqm);
        printf("# area %f nsamples %d \n", area, nsamples);
        

        for (int j = 0; j < nsamples; j++) {
            float lambda_a = 1;
            float lambda_b = 1;

            while (lambda_a + lambda_b > 1) {
              lambda_a = distribution(generator);
              lambda_b = distribution(generator);
            }

            float coordx = tc[0][0] + lambda_a * (tc[1][0] - tc[0][0]) + lambda_b*(tc[2][0] - tc[0][0]);
            float coordy = tc[0][1] + lambda_a * (tc[1][1] - tc[0][1]) + lambda_b*(tc[2][1] - tc[0][1]);

            if (coordx < 0) coordx = 0;
            if (coordx > 1) coordx = 1;
            if (coordy < 0) coordy = 0;
            if (coordy > 1) coordy = 1;

            int x = int(coordx * w);
            int y = int(coordy * h);

            unsigned char r = image[comp*(y * w + x)];
            unsigned char g = image[comp*(y * w + x) + 1];
            unsigned char b = image[comp*(y * w + x) + 2];

            float px = v[0][0] + lambda_a*(v[1][0] - v[0][0]) + lambda_b*(v[2][0] - v[0][0]);
            float py = v[0][1] + lambda_a*(v[1][1] - v[0][1]) + lambda_b*(v[2][1] - v[0][1]);
            float pz = v[0][2] + lambda_a*(v[1][2] - v[0][2]) + lambda_b*(v[2][2] - v[0][2]);

            float nx = n[0][0] + lambda_a*(n[1][0] - n[0][0]) + lambda_b*(n[2][0] - n[0][0]);
            float ny = n[0][1] + lambda_a*(n[1][1] - n[0][1]) + lambda_b*(n[2][1] - n[0][1]);
            float nz = n[0][2] + lambda_a*(n[1][2] - n[0][2]) + lambda_b*(n[2][2] - n[0][2]);

            printf("%f %f %f %f %f %f %d %d %d\n", px, py, pz, nx, ny, nz, int(r), int(g), int(b));
        }

    }


    stbi_image_free(image);

    return 0;
}